

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::Decode
          (GED_EnhancedRotaryWingAircraft *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x1b < KVar1) {
    GED_BasicRotorWingAircraft::Decode(&this->super_GED_BasicRotorWingAircraft,stream);
    KDataStream::Read(stream,&(this->super_GED_BasicRotorWingAircraft).field_0x2c);
    KDataStream::Read(stream,&(this->super_GED_BasicRotorWingAircraft).field_0x2d);
    KDataStream::Read(stream,&(this->super_GED_BasicRotorWingAircraft).field_0x2e);
    KDataStream::Read(stream,&(this->super_GED_BasicRotorWingAircraft).field_0x2f);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GED_EnhancedRotaryWingAircraft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_ENHANCED_ROTARY_WING_AIRCRAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    GED_BasicRotorWingAircraft::Decode( stream );

    stream >> m_ui8SupFuelStatus
           >> m_ui8AirMaintStatus
           >> m_ui8PriAmmun
           >> m_ui8SecAmmun;
}